

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O2

void __thiscall
QHybrid::QHybrid(QHybrid *this,void **vtt,PlanningUnitDecPOMDPDiscrete *pu,
                Qheur_t QheurTypeFirstTimeSteps,QFunctionJointBeliefInterface *QlastTimeSteps,
                size_t horizonLastTimeSteps)

{
  QFunctionJAOHInterface QVar1;
  long lVar2;
  E *this_00;
  
  QFunctionJAOHInterface::QFunctionJAOHInterface(&this->super_QFunctionJAOHInterface,vtt + 1);
  QVar1 = (QFunctionJAOHInterface)*vtt;
  this->super_QFunctionJAOHInterface = QVar1;
  *(void **)(&(this->super_QFunctionJAOHInterface).field_0x0 + *(long *)((long)QVar1 + -0x80)) =
       vtt[4];
  *(void **)(&(this->super_QFunctionJAOHInterface).field_0x0 +
            *(long *)((long)this->super_QFunctionJAOHInterface + -0x60)) = vtt[5];
  *(void **)(&(this->super_QFunctionJAOHInterface).field_0x0 +
            *(long *)((long)this->super_QFunctionJAOHInterface + -0x88)) = vtt[6];
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.size_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.data_ = (pointer)0x0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.size1_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_matrix_t.size2_ = 0;
  (this->_m_QValuesFirstTimeSteps).super_QTableInterface._vptr_QTableInterface =
       (_func_int **)&PTR_Get_00604bb0;
  this->_m_QheurTypeFirstTS = QheurTypeFirstTimeSteps;
  this->_m_QlastTimeSteps = QlastTimeSteps;
  this->_m_horizonLastTimeSteps = horizonLastTimeSteps;
  lVar2 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
  lVar2 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar2) + 0x60))
                    (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar2);
  this->_m_horizonFirstTimeSteps = *(long *)(lVar2 + 0x18) - horizonLastTimeSteps;
  this->_m_optimizedHorLast = false;
  this->_m_initialized = false;
  lVar2 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
  lVar2 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar2) + 0x60))
                    (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar2);
  if (horizonLastTimeSteps < *(ulong *)(lVar2 + 0x18)) {
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"QHybrid horizonLastTimeSteps should be at least 1 less than the problem horizon");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

QHybrid::QHybrid(const PlanningUnitDecPOMDPDiscrete* pu,
                 Qheur_t QheurTypeFirstTimeSteps,
                 QFunctionJointBeliefInterface *QlastTimeSteps,
                 size_t horizonLastTimeSteps) : 
    QFunctionForDecPOMDP(pu), //virtual base first
    _m_QheurTypeFirstTS(QheurTypeFirstTimeSteps),
    _m_QlastTimeSteps(QlastTimeSteps),
    _m_horizonLastTimeSteps(horizonLastTimeSteps),
    _m_horizonFirstTimeSteps(GetPU()->GetHorizon()-horizonLastTimeSteps),
    _m_optimizedHorLast(false),
    _m_initialized(false)
{
    if(horizonLastTimeSteps>=GetPU()->GetHorizon())
        throw(E("QHybrid horizonLastTimeSteps should be at least 1 less than the problem horizon"));
}